

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Node16ShrinkToNode4DeleteEnd_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node16ShrinkToNode4DeleteEnd_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  initializer_list<int> absent_keys;
  int local_1b4 [3];
  iterator local_1a8;
  undefined8 local_1a0;
  node_type_counter_array local_198;
  inode_type_counter_array local_168;
  unsigned_long local_148;
  unsigned_long uStackY_140;
  unsigned_long uStackY_138;
  unsigned_long in_stack_fffffffffffffed0;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffed8;
  undefined1 local_110 [8];
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTCorrectnessTest_Node16ShrinkToNode4DeleteEnd_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffffed8,SUB81(in_stack_fffffffffffffed0 >> 0x38,0));
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_key_range<int>
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110,1,5,false);
  local_148 = 5;
  uStackY_140 = 0;
  uStackY_138 = 1;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110,(node_type_counter_array *)&local_148);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)local_110,5,false);
  local_168._M_elems[0] = 0;
  local_168._M_elems[1] = 1;
  local_168._M_elems[2] = 0;
  local_168._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_shrinking_inodes
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110,&local_168);
  local_198._M_elems[0] = 4;
  local_198._M_elems[1] = 1;
  local_198._M_elems[2] = 0;
  local_198._M_elems[3] = 0;
  local_198._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110,&local_198);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110);
  local_1b4[0] = 0;
  local_1b4[1] = 5;
  local_1b4[2] = 6;
  local_1a8 = local_1b4;
  local_1a0 = 3;
  absent_keys._M_len = 3;
  absent_keys._M_array = local_1a8;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>
            ((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_110,absent_keys);
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)local_110);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node16ShrinkToNode4DeleteEnd) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 5);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({5, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.remove(5);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({0, 1, 0, 0});
  verifier.assert_node_counts({4, 1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  verifier.check_present_values();
  verifier.check_absent_keys({0, 5, 6});
}